

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O3

uint __thiscall xercesc_4_0::NamespaceScope::increaseDepth(NamespaceScope *this)

{
  StackElem **ppSVar1;
  uint uVar2;
  StackElem *pSVar3;
  
  uVar2 = this->fStackTop;
  if (uVar2 == this->fStackCapacity) {
    expandStack(this);
    uVar2 = this->fStackTop;
  }
  pSVar3 = this->fStack[uVar2];
  if (pSVar3 == (StackElem *)0x0) {
    pSVar3 = (StackElem *)XMemory::operator_new(0x10,this->fMemoryManager);
    uVar2 = this->fStackTop;
    this->fStack[uVar2] = pSVar3;
    ppSVar1 = this->fStack;
    pSVar3 = ppSVar1[uVar2];
    pSVar3->fMapCapacity = 0;
    pSVar3->fMap = (PrefMapElem *)0x0;
    pSVar3 = ppSVar1[uVar2];
  }
  pSVar3->fMapCount = 0;
  this->fStackTop = uVar2 + 1;
  return uVar2;
}

Assistant:

unsigned int NamespaceScope::increaseDepth()
{
    // See if we need to expand the stack
    if (fStackTop == fStackCapacity)
        expandStack();

    // If this element has not been initialized yet, then initialize it
    if (!fStack[fStackTop])
    {
        fStack[fStackTop] = new (fMemoryManager) StackElem;
        fStack[fStackTop]->fMapCapacity = 0;
        fStack[fStackTop]->fMap = 0;
    }

    // Set up the new top row
    fStack[fStackTop]->fMapCount = 0;

    // Bump the top of stack
    fStackTop++;

    return fStackTop-1;
}